

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O1

bool semver::operator==(version<int,_int,_int> *lhs,version<int,_int,_int> *rhs)

{
  int iVar1;
  undefined8 uStack_8;
  
  if (((lhs->major_ == rhs->major_) && (lhs->minor_ == rhs->minor_)) &&
     (uStack_8 = (ulong)(uint)lhs->patch_, lhs->patch_ == rhs->patch_)) {
    iVar1 = detail::prerelease_comparator::compare<int,int,int>
                      ((prerelease_comparator *)((long)&uStack_8 + 7),lhs,rhs);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

[[nodiscard]] SEMVER_CONSTEXPR bool operator==(const version<I1, I2, I3>& lhs, const version<I1, I2, I3>& rhs) noexcept {
  return detail::compare_parsed(lhs, rhs, version_compare_option::include_prerelease) == 0;
}